

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor,bool qualified)

{
  Descriptor *pDVar1;
  string *psVar2;
  undefined1 qualified_00;
  string local_40;
  byte local_19;
  cpp *pcStack_18;
  bool qualified_local;
  EnumDescriptor *enum_descriptor_local;
  string *result;
  
  local_19 = (byte)enum_descriptor & 1;
  psVar2 = __return_storage_ptr__;
  pcStack_18 = this;
  enum_descriptor_local = (EnumDescriptor *)__return_storage_ptr__;
  pDVar1 = EnumDescriptor::containing_type((EnumDescriptor *)this);
  qualified_00 = SUB81(psVar2,0);
  if (pDVar1 == (Descriptor *)0x0) {
    if ((local_19 & 1) == 0) {
      psVar2 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)pcStack_18);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    }
    else {
      psVar2 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)pcStack_18);
      anon_unknown_0::DotsToColons(&local_40,psVar2);
      std::operator+(__return_storage_ptr__,"::",&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    pDVar1 = EnumDescriptor::containing_type((EnumDescriptor *)pcStack_18);
    ClassName_abi_cxx11_
              (__return_storage_ptr__,(cpp *)pDVar1,(Descriptor *)(ulong)(local_19 & 1),
               (bool)qualified_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
    psVar2 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)pcStack_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const EnumDescriptor* enum_descriptor, bool qualified) {
  if (enum_descriptor->containing_type() == NULL) {
    if (qualified) {
      return "::" + DotsToColons(enum_descriptor->full_name());
    } else {
      return enum_descriptor->name();
    }
  } else {
    string result = ClassName(enum_descriptor->containing_type(), qualified);
    result += '_';
    result += enum_descriptor->name();
    return result;
  }
}